

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.cpp
# Opt level: O2

void testOpenScans(string *tempdir)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  undefined8 extraout_RAX;
  char *in_RCX;
  exr_context_t f;
  string fn;
  undefined1 local_a0 [8];
  undefined8 local_98 [4];
  undefined8 local_78;
  code *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_98,
             "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRCoreTest/../OpenEXRTest/"
             ,(allocator<char> *)&local_78);
  std::__cxx11::string::append((char *)local_98);
  local_28 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_18 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0x68;
  uStack_20 = 0xbf800000fffffffe;
  local_70 = err_cb;
  iVar1 = exr_start_read(local_a0,local_98[0]);
  if (iVar1 == 0) {
    exr_finish(local_a0);
    std::__cxx11::string::assign((char *)local_98);
    std::__cxx11::string::append((char *)local_98);
    iVar1 = exr_start_read(local_a0,local_98[0],&local_78);
    if (iVar1 == 0) {
      exr_finish(local_a0);
      std::__cxx11::string::assign((char *)local_98);
      std::__cxx11::string::append((char *)local_98);
      iVar1 = exr_start_read(local_a0,local_98[0],&local_78);
      if (iVar1 == 0) {
        exr_finish(local_a0);
        std::__cxx11::string::~string((string *)local_98);
        return;
      }
      goto LAB_00131e8f;
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,") ");
    pcVar3 = (char *)exr_get_default_error_message(iVar1);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
    core_test_fail("exr_start_read (&f, fn.c_str (), &cinit)",(char *)0xd1,0x31f612,in_RCX);
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,") ");
  pcVar3 = (char *)exr_get_default_error_message(iVar1);
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  core_test_fail("exr_start_read (&f, fn.c_str (), &cinit)",(char *)0xd6,0x31f612,in_RCX);
LAB_00131e8f:
  poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,") ");
  pcVar3 = (char *)exr_get_default_error_message(iVar1);
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  core_test_fail("exr_start_read (&f, fn.c_str (), &cinit)",(char *)0xdb,0x31f612,in_RCX);
  std::__cxx11::string::~string((string *)local_98);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void
testOpenScans (const std::string& tempdir)
{
    exr_context_t f;
    std::string   fn = ILM_IMF_TEST_IMAGEDIR;
    fn += "v1.7.test.1.exr";

    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;
    cinit.error_handler_fn          = &err_cb;

    EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));
    exr_finish (&f);

    fn = ILM_IMF_TEST_IMAGEDIR;
    fn += "v1.7.test.planar.exr";
    EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));
    exr_finish (&f);

    fn = ILM_IMF_TEST_IMAGEDIR;
    fn += "v1.7.test.interleaved.exr";
    EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));
    exr_finish (&f);
}